

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void random_advance_counter(void)

{
  ssh_hashalg *psVar1;
  
  ssh_hash_reset(random_hash);
  BinarySink_put_asciz(random_hash->binarysink_,random_seedstr);
  BinarySink_put_uint64(random_hash->binarysink_,random_counter);
  random_counter = random_counter + 1;
  psVar1 = ssh_hash_alg(random_hash);
  random_buf_limit = psVar1->hlen;
  ssh_hash_digest(random_hash,random_buf);
  return;
}

Assistant:

static void random_advance_counter(void)
{
    ssh_hash_reset(random_hash);
    put_asciz(random_hash, random_seedstr);
    put_uint64(random_hash, random_counter);
    random_counter++;
    random_buf_limit = ssh_hash_alg(random_hash)->hlen;
    ssh_hash_digest(random_hash, random_buf);
}